

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Versions.cpp
# Opt level: O3

bool __thiscall
glslang::TParseVersions::checkExtensionsRequested
          (TParseVersions *this,TSourceLoc *loc,int numExtensions,char **extensions,
          char *featureDesc)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_11
  *paVar1;
  EShMessages EVar2;
  TInfoSink *this_00;
  char *__s;
  size_type *psVar3;
  int iVar4;
  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *pbVar5;
  bool bVar6;
  ulong uVar7;
  pool_allocator<char> local_d8;
  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> local_a8;
  TPoolAllocator *local_80;
  size_type *local_78;
  size_type local_70;
  size_type local_68;
  undefined8 uStack_60;
  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> local_58;
  
  if (0 < numExtensions) {
    uVar7 = 0;
    do {
      iVar4 = (*this->_vptr_TParseVersions[7])(this,extensions[uVar7]);
      if (0xfffffffd < iVar4 - 3U) {
        return true;
      }
      uVar7 = uVar7 + 1;
    } while ((uint)numExtensions != uVar7);
    if (0 < numExtensions) {
      uVar7 = 0;
      bVar6 = false;
      do {
        iVar4 = (*this->_vptr_TParseVersions[7])(this,extensions[uVar7]);
        if (iVar4 == 3) {
LAB_0035eaff:
          this_00 = this->infoSink;
          __s = extensions[uVar7];
          local_d8.allocator = GetThreadPoolAllocator();
          std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
          basic_string<glslang::std::allocator<char>>
                    ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)
                     &local_58,__s,&local_d8);
          pbVar5 = std::__cxx11::
                   basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
                   replace(&local_58,0,0,"extension ",10);
          local_a8._M_dataplus.super_allocator_type.allocator =
               (pbVar5->_M_dataplus).super_allocator_type.allocator;
          local_a8._M_dataplus._M_p = (pbVar5->_M_dataplus)._M_p;
          paVar1 = &pbVar5->field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_11
               *)local_a8._M_dataplus._M_p == paVar1) {
            local_a8.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
            local_a8.field_2._8_8_ = *(undefined8 *)((long)&pbVar5->field_2 + 8);
            local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
          }
          else {
            local_a8.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
          }
          local_a8._M_string_length = pbVar5->_M_string_length;
          (pbVar5->_M_dataplus)._M_p = (pointer)paVar1;
          pbVar5->_M_string_length = 0;
          (pbVar5->field_2)._M_local_buf[0] = '\0';
          pbVar5 = std::__cxx11::
                   basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
                   append(&local_a8," is being used for ");
          local_d0._M_dataplus.super_allocator_type.allocator =
               (pbVar5->_M_dataplus).super_allocator_type.allocator;
          local_d0._M_dataplus._M_p = (pbVar5->_M_dataplus)._M_p;
          paVar1 = &pbVar5->field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_11
               *)local_d0._M_dataplus._M_p == paVar1) {
            local_d0.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
            local_d0.field_2._8_8_ = *(undefined8 *)((long)&pbVar5->field_2 + 8);
            local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
          }
          else {
            local_d0.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
          }
          local_d0._M_string_length = pbVar5->_M_string_length;
          (pbVar5->_M_dataplus)._M_p = (pointer)paVar1;
          pbVar5->_M_string_length = 0;
          (pbVar5->field_2)._M_local_buf[0] = '\0';
          pbVar5 = std::__cxx11::
                   basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
                   append(&local_d0,featureDesc);
          local_80 = (pbVar5->_M_dataplus).super_allocator_type.allocator;
          local_78 = &local_68;
          psVar3 = (size_type *)(pbVar5->_M_dataplus)._M_p;
          paVar1 = &pbVar5->field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_11
               *)psVar3 == paVar1) {
            local_68 = paVar1->_M_allocated_capacity;
            uStack_60 = *(undefined8 *)((long)&pbVar5->field_2 + 8);
          }
          else {
            local_68 = paVar1->_M_allocated_capacity;
            local_78 = psVar3;
          }
          local_70 = pbVar5->_M_string_length;
          (pbVar5->_M_dataplus)._M_p = (pointer)paVar1;
          pbVar5->_M_string_length = 0;
          (pbVar5->field_2)._M_local_buf[0] = '\0';
          TInfoSinkBase::message
                    (&this_00->info,EPrefixWarning,(char *)local_78,loc,
                     (bool)((byte)(this->messages >> 0x10) & 1),
                     (bool)((byte)(this->messages >> 0x11) & 1));
          bVar6 = true;
        }
        else if ((iVar4 == 4) &&
                (EVar2 = this->messages, (EVar2 & EShMsgRelaxedErrors) != EShMsgDefault)) {
          TInfoSinkBase::message
                    (&this->infoSink->info,EPrefixWarning,
                     "The following extension must be enabled to use this feature:",loc,
                     (bool)((byte)(EVar2 >> 0x10) & 1),(bool)((byte)(EVar2 >> 0x11) & 1));
          goto LAB_0035eaff;
        }
        uVar7 = uVar7 + 1;
        if ((uint)numExtensions == uVar7) {
          return bVar6;
        }
      } while( true );
    }
  }
  return false;
}

Assistant:

bool TParseVersions::checkExtensionsRequested(const TSourceLoc& loc, int numExtensions, const char* const extensions[], const char* featureDesc)
{
    // First, see if any of the extensions are enabled
    for (int i = 0; i < numExtensions; ++i) {
        TExtensionBehavior behavior = getExtensionBehavior(extensions[i]);
        if (behavior == EBhEnable || behavior == EBhRequire)
            return true;
    }

    // See if any extensions want to give a warning on use; give warnings for all such extensions
    bool warned = false;
    for (int i = 0; i < numExtensions; ++i) {
        TExtensionBehavior behavior = getExtensionBehavior(extensions[i]);
        if (behavior == EBhDisable && relaxedErrors()) {
            infoSink.info.message(EPrefixWarning, "The following extension must be enabled to use this feature:", loc,
                                  messages & EShMsgAbsolutePath, messages & EShMsgDisplayErrorColumn);
            behavior = EBhWarn;
        }
        if (behavior == EBhWarn) {
            infoSink.info.message(EPrefixWarning,
                                  ("extension " + TString(extensions[i]) + " is being used for " + featureDesc).c_str(),
                                  loc, messages & EShMsgAbsolutePath, messages & EShMsgDisplayErrorColumn);
            warned = true;
        }
    }
    if (warned)
        return true;
    return false;
}